

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_write_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  mbedtls_ssl_config *pmVar3;
  mbedtls_ecp_curve_info **ppmVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  bool bVar6;
  mbedtls_ecp_curve_info *pmVar7;
  mbedtls_ecp_curve_info **ppmVar8;
  byte bVar9;
  uchar uVar10;
  int iVar11;
  int iVar12;
  mbedtls_md_type_t mVar13;
  uint uVar14;
  mbedtls_ecp_group_id *pmVar15;
  mbedtls_md_info_t *pmVar16;
  size_t sVar17;
  mbedtls_ssl_key_cert *pmVar18;
  mbedtls_ecp_group_id mVar19;
  uchar *unaff_RBP;
  mbedtls_pk_context *pmVar20;
  char *text;
  uchar *input;
  uchar *output;
  mbedtls_ecp_curve_info **ppmVar21;
  uchar *puVar22;
  size_t signature_len;
  size_t len;
  uchar hash [64];
  mbedtls_md_context_t ctx;
  mbedtls_md5_context mbedtls_md5;
  size_t local_158;
  long local_150;
  undefined8 local_140;
  size_t local_138;
  mbedtls_md_type_t local_12c;
  uchar local_128 [16];
  uchar local_118 [48];
  mbedtls_sha1_context local_e8;
  mbedtls_md5_context local_88;
  
  puVar22 = ssl->out_msg;
  pmVar2 = ssl->transform_negotiate->ciphersuite_info;
  input = puVar22 + 4;
  local_150 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xa7f,"=> write server key exchange");
  mVar1 = pmVar2->key_exchange;
  output = input;
  if (mVar1 < MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
    if ((0xa2U >> (mVar1 & 0x1f) & 1) != 0) {
      iVar11 = 0xa88;
LAB_00116b3d:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,iVar11,"<= skip write server key exchange");
      ssl->state = ssl->state + 1;
      return 0;
    }
    if ((0x140U >> (mVar1 & 0x1f) & 1) == 0) {
      if ((0x600U >> (mVar1 & 0x1f) & 1) != 0) {
        if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
           (pmVar18 = ssl->handshake->key_cert, pmVar18 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar18 = ssl->conf->key_cert;
        }
        if (pmVar18 == (mbedtls_ssl_key_cert *)0x0) {
          pmVar20 = (mbedtls_pk_context *)0x0;
        }
        else {
          pmVar20 = pmVar18->key;
        }
        iVar11 = mbedtls_pk_can_do(pmVar20,MBEDTLS_PK_ECKEY);
        if (iVar11 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xa59,"server key not ECDH capable");
        }
        else {
          pmVar5 = ssl->handshake;
          if ((pmVar5 == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar18 = pmVar5->key_cert, pmVar18 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar18 = ssl->conf->key_cert;
          }
          iVar11 = mbedtls_ecdh_get_params
                             (&pmVar5->ecdh_ctx,(mbedtls_ecp_keypair *)pmVar18->key->pk_ctx,
                              MBEDTLS_ECDH_OURS);
          if (iVar11 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xa61,"mbedtls_ecdh_get_params",iVar11);
          }
        }
        iVar11 = 0xa95;
        goto LAB_00116b3d;
      }
    }
    else {
      puVar22[4] = '\0';
      puVar22[5] = '\0';
      local_150 = 2;
      output = puVar22 + 6;
    }
  }
  if ((pmVar2->key_exchange | MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) == MBEDTLS_KEY_EXCHANGE_DHE_PSK) {
    pmVar3 = ssl->conf;
    if (((pmVar3->dhm_P).p == (mbedtls_mpi_uint *)0x0) ||
       ((pmVar3->dhm_G).p == (mbedtls_mpi_uint *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xac4,"no DH parameters set");
      return -0x7100;
    }
    iVar11 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).P,&pmVar3->dhm_P);
    if ((iVar11 != 0) ||
       (iVar11 = mbedtls_mpi_copy(&(ssl->handshake->dhm_ctx).G,&ssl->conf->dhm_G), iVar11 != 0)) {
      text = "mbedtls_mpi_copy";
      iVar12 = 0xad4;
      goto LAB_00117216;
    }
    pmVar5 = ssl->handshake;
    sVar17 = mbedtls_mpi_size(&(pmVar5->dhm_ctx).P);
    iVar11 = mbedtls_dhm_make_params
                       (&pmVar5->dhm_ctx,(int)sVar17,output,&local_138,
                        (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
    if (iVar11 != 0) {
      text = "mbedtls_dhm_make_params";
      iVar12 = 0xadc;
      goto LAB_00117216;
    }
    unaff_RBP = output + local_138;
    local_158 = local_138;
    local_150 = local_150 + local_138;
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae6,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae7,"DHM: P ",&(ssl->handshake->dhm_ctx).P);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae8,"DHM: G ",&(ssl->handshake->dhm_ctx).G);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xae9,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
    input = output;
    output = unaff_RBP;
  }
  else {
    local_158 = 0;
  }
  iVar11 = (int)unaff_RBP;
  puVar22 = output;
  if ((pmVar2->key_exchange < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) &&
     ((0x118U >> (pmVar2->key_exchange & 0x1f) & 1) != 0)) {
    pmVar15 = ssl->conf->curve_list;
    mVar19 = *pmVar15;
    if (mVar19 == MBEDTLS_ECP_DP_NONE) {
      ppmVar21 = (mbedtls_ecp_curve_info **)0x0;
    }
    else {
      ppmVar4 = ssl->handshake->curves;
      ppmVar8 = ppmVar4;
      pmVar7 = *ppmVar4;
      do {
        while (ppmVar21 = ppmVar8, pmVar7 != (mbedtls_ecp_curve_info *)0x0) {
          if (pmVar7->grp_id == mVar19) goto LAB_00116b66;
          ppmVar8 = ppmVar21 + 1;
          pmVar7 = ppmVar21[1];
        }
        mVar19 = pmVar15[1];
        pmVar15 = pmVar15 + 1;
        ppmVar8 = ppmVar4;
        pmVar7 = *ppmVar4;
      } while (mVar19 != MBEDTLS_ECP_DP_NONE);
    }
LAB_00116b66:
    if ((ppmVar21 == (mbedtls_ecp_curve_info **)0x0) || (*ppmVar21 == (mbedtls_ecp_curve_info *)0x0)
       ) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb07,"no matching curve for ECDHE");
      iVar12 = -0x7380;
LAB_00116c13:
      bVar6 = false;
      iVar11 = iVar12;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb0b,"ECDHE curve: %s",(*ppmVar21)->name);
      iVar12 = mbedtls_ecp_group_load(&(ssl->handshake->ecdh_ctx).grp,(*ppmVar21)->grp_id);
      if (iVar12 != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb10,"mbedtls_ecp_group_load",iVar12);
        goto LAB_00116c13;
      }
      iVar12 = mbedtls_ecdh_make_params
                         (&ssl->handshake->ecdh_ctx,&local_138,output,0x4000 - local_150,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar12 == 0) {
        puVar22 = output + local_138;
        local_158 = local_138;
        local_150 = local_150 + local_138;
        mbedtls_debug_print_ecp
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb22,"ECDH: Q ",&(ssl->handshake->ecdh_ctx).Q);
        bVar6 = true;
        input = output;
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xb18,"mbedtls_ecdh_make_params",iVar12);
        bVar6 = false;
        iVar11 = iVar12;
      }
    }
    if (!bVar6) {
      return iVar11;
    }
  }
  if (pmVar2->key_exchange - MBEDTLS_KEY_EXCHANGE_DHE_RSA < 3) {
    local_140 = 0;
    if (ssl->minor_ver == 3) {
      mVar13 = mbedtls_ssl_md_alg_from_hash((uchar)ssl->handshake->sig_alg);
      if (mVar13 != MBEDTLS_MD_NONE) goto LAB_00116c96;
      sVar17 = 0;
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xb3c,"should never happen");
      iVar11 = -0x6c00;
    }
    else {
      mVar13 = (uint)(pmVar2->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) << 2;
LAB_00116c96:
      local_12c = mVar13;
      if (mVar13 == MBEDTLS_MD_NONE) {
        mbedtls_md5_init(&local_88);
        mbedtls_sha1_init(&local_e8);
        mbedtls_md5_starts(&local_88);
        mbedtls_md5_update(&local_88,ssl->handshake->randbytes,0x40);
        mbedtls_md5_update(&local_88,input,local_158);
        mbedtls_md5_finish(&local_88,local_128);
        mbedtls_sha1_starts(&local_e8);
        mbedtls_sha1_update(&local_e8,ssl->handshake->randbytes,0x40);
        mbedtls_sha1_update(&local_e8,input,local_158);
        mbedtls_sha1_finish(&local_e8,local_118);
        mbedtls_md5_free(&local_88);
        mbedtls_sha1_free(&local_e8);
        sVar17 = 0x24;
      }
      else {
        pmVar16 = mbedtls_md_info_from_type(mVar13);
        mbedtls_md_init((mbedtls_md_context_t *)&local_e8);
        iVar12 = mbedtls_md_setup((mbedtls_md_context_t *)&local_e8,pmVar16,0);
        if (iVar12 == 0) {
          mbedtls_md_starts((mbedtls_md_context_t *)&local_e8);
          mbedtls_md_update((mbedtls_md_context_t *)&local_e8,ssl->handshake->randbytes,0x40);
          mbedtls_md_update((mbedtls_md_context_t *)&local_e8,input,local_158);
          mbedtls_md_finish((mbedtls_md_context_t *)&local_e8,local_128);
          mbedtls_md_free((mbedtls_md_context_t *)&local_e8);
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xb90,"mbedtls_md_setup",iVar12);
          iVar11 = iVar12;
        }
        sVar17 = 0;
        if (iVar12 != 0) goto LAB_001171c2;
      }
      mVar13 = local_12c;
      uVar14 = (uint)sVar17;
      if (local_12c != MBEDTLS_MD_NONE) {
        pmVar16 = mbedtls_md_info_from_type(local_12c);
        bVar9 = mbedtls_md_get_size(pmVar16);
        uVar14 = (uint)bVar9;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xba3,"parameters hash",local_128,(ulong)uVar14);
      pmVar5 = ssl->handshake;
      if ((pmVar5 == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar18 = pmVar5->key_cert, pmVar18 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar18 = ssl->conf->key_cert;
      }
      if ((pmVar18 == (mbedtls_ssl_key_cert *)0x0) || (pmVar18->key == (mbedtls_pk_context *)0x0)) {
        sVar17 = 0;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xbaa,"got no private key");
        iVar11 = -0x7600;
      }
      else {
        if (ssl->minor_ver == 3) {
          *puVar22 = (uchar)pmVar5->sig_alg;
          if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar18 = ssl->handshake->key_cert, pmVar18 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar18 = ssl->conf->key_cert;
          }
          if (pmVar18 == (mbedtls_ssl_key_cert *)0x0) {
            pmVar20 = (mbedtls_pk_context *)0x0;
          }
          else {
            pmVar20 = pmVar18->key;
          }
          uVar10 = mbedtls_ssl_sig_from_pk(pmVar20);
          puVar22[1] = uVar10;
          puVar22 = puVar22 + 2;
          local_150 = local_150 + 2;
        }
        if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
           (pmVar18 = ssl->handshake->key_cert, pmVar18 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar18 = ssl->conf->key_cert;
        }
        if (pmVar18 == (mbedtls_ssl_key_cert *)0x0) {
          pmVar20 = (mbedtls_pk_context *)0x0;
        }
        else {
          pmVar20 = pmVar18->key;
        }
        iVar12 = mbedtls_pk_sign(pmVar20,mVar13,local_128,sVar17,puVar22 + 2,&local_140,
                                 (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                 ssl->conf->p_rng);
        if (iVar12 == 0) {
          *puVar22 = local_140._1_1_;
          puVar22[1] = (uchar)local_140;
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xbc4,"my signature",puVar22 + 2,local_140);
          local_150 = local_140 + local_150 + 2;
          sVar17 = 1;
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xbbc,"mbedtls_pk_sign",iVar12);
          sVar17 = 0;
          iVar11 = iVar12;
        }
      }
    }
LAB_001171c2:
    if ((char)sVar17 == '\0') {
      return iVar11;
    }
  }
  ssl->out_msglen = local_150 + 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\f';
  ssl->state = ssl->state + 1;
  iVar11 = mbedtls_ssl_write_record(ssl);
  if (iVar11 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xbd8,"<= write server key exchange");
    return 0;
  }
  text = "mbedtls_ssl_write_record";
  iVar12 = 0xbd4;
LAB_00117216:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,iVar12,text,iVar11);
  return iVar11;
}

Assistant:

static int ssl_write_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t n = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
                            ssl->transform_negotiate->ciphersuite_info;

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    unsigned char *p = ssl->out_msg + 4;
    unsigned char *dig_signed = p;
    size_t dig_signed_len = 0, len;
    ((void) dig_signed);
    ((void) dig_signed_len);
    ((void) len);
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                           \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        ssl_get_ecdh_params_from_cert( ssl );

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        size_t jlen;
        const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;

        ret = mbedtls_ecjpake_write_round_two( &ssl->handshake->ecjpake_ctx,
                p, end - p, &jlen, ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecjpake_write_round_two", ret );
            return( ret );
        }

        p += jlen;
        n += jlen;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /* Note: we don't support identity hints, until someone asks
         * for them. */
        *(p++) = 0x00;
        *(p++) = 0x00;

        n += 2;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl->conf->dhm_P.p == NULL || ssl->conf->dhm_G.p == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no DH parameters set" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * Ephemeral DH parameters:
         *
         * struct {
         *     opaque dh_p<1..2^16-1>;
         *     opaque dh_g<1..2^16-1>;
         *     opaque dh_Ys<1..2^16-1>;
         * } ServerDHParams;
         */
        if( ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.P, &ssl->conf->dhm_P ) ) != 0 ||
            ( ret = mbedtls_mpi_copy( &ssl->handshake->dhm_ctx.G, &ssl->conf->dhm_G ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_mpi_copy", ret );
            return( ret );
        }

        if( ( ret = mbedtls_dhm_make_params( &ssl->handshake->dhm_ctx,
                        (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                        p, &len, ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: P ", &ssl->handshake->dhm_ctx.P  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: G ", &ssl->handshake->dhm_ctx.G  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /*
         * Ephemeral ECDH parameters:
         *
         * struct {
         *     ECParameters curve_params;
         *     ECPoint      public;
         * } ServerECDHParams;
         */
        const mbedtls_ecp_curve_info **curve = NULL;
        const mbedtls_ecp_group_id *gid;

        /* Match our preference list against the offered curves */
        for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
            for( curve = ssl->handshake->curves; *curve != NULL; curve++ )
                if( (*curve)->grp_id == *gid )
                    goto curve_matching_done;

curve_matching_done:
        if( curve == NULL || *curve == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "no matching curve for ECDHE" ) );
            return( MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDHE curve: %s", (*curve)->name ) );

        if( ( ret = mbedtls_ecp_group_load( &ssl->handshake->ecdh_ctx.grp,
                                       (*curve)->grp_id ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecp_group_load", ret );
            return( ret );
        }

        if( ( ret = mbedtls_ecdh_make_params( &ssl->handshake->ecdh_ctx, &len,
                                      p, MBEDTLS_SSL_MAX_CONTENT_LEN - n,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_params", ret );
            return( ret );
        }

        dig_signed = p;
        dig_signed_len = len;

        p += len;
        n += len;

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q ", &ssl->handshake->ecdh_ctx.Q );
    }
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__ECDHE_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t signature_len = 0;
        unsigned int hashlen = 0;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;

        /*
         * Choose hash algorithm. NONE means MD5 + SHA1 here.
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            md_alg = mbedtls_ssl_md_alg_from_hash( ssl->handshake->sig_alg );

            if( md_alg == MBEDTLS_MD_NONE )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ciphersuite_info->key_exchange ==
                  MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
        {
            md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            md_alg = MBEDTLS_MD_NONE;
        }

        /*
         * Compute the hash to be signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes,  64 );
            mbedtls_md5_update( &mbedtls_md5, dig_signed, dig_signed_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes,  64 );
            mbedtls_sha1_update( &mbedtls_sha1, dig_signed, dig_signed_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            hashlen = 36;

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;
            const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, dig_signed, dig_signed_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        /*
         * Make the signature
         */
        if( mbedtls_ssl_own_key( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            *(p++) = ssl->handshake->sig_alg;
            *(p++) = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

            n += 2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash, hashlen,
                        p + 2 , &signature_len,
                        ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( signature_len >> 8 );
        *(p++) = (unsigned char)( signature_len      );
        n += 2;

        MBEDTLS_SSL_DEBUG_BUF( 3, "my signature", p, signature_len );

        n += signature_len;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

    ssl->out_msglen  = 4 + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server key exchange" ) );

    return( 0 );
}